

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

Aig_Obj_t ** Fra_RefineClassOne(Fra_Cla_t *p,Aig_Obj_t **ppClass)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Man_t *pObj_00;
  Aig_Man_t *local_78;
  Aig_Obj_t *local_58;
  int local_34;
  Aig_Obj_t **ppAStack_30;
  int i;
  Aig_Obj_t **ppThis;
  Aig_Obj_t *pObj;
  Aig_Obj_t **ppClass_local;
  Fra_Cla_t *p_local;
  
  if ((*ppClass != (Aig_Obj_t *)0x0) && (ppClass[1] != (Aig_Obj_t *)0x0)) {
    ppAStack_30 = ppClass + 1;
    while ((pAVar2 = *ppAStack_30, pAVar2 != (Aig_Obj_t *)0x0 &&
           (iVar1 = (*p->pFuncNodesAreEqual)(*ppClass,pAVar2), iVar1 != 0))) {
      ppAStack_30 = ppAStack_30 + 1;
    }
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      p_local = (Fra_Cla_t *)0x0;
    }
    else {
      Vec_PtrClear(p->vClassOld);
      Vec_PtrClear(p->vClassNew);
      Vec_PtrPush(p->vClassOld,*ppClass);
      for (ppAStack_30 = ppClass + 1; pAVar2 = *ppAStack_30, pAVar2 != (Aig_Obj_t *)0x0;
          ppAStack_30 = ppAStack_30 + 1) {
        iVar1 = (*p->pFuncNodesAreEqual)(*ppClass,pAVar2);
        if (iVar1 == 0) {
          Vec_PtrPush(p->vClassNew,pAVar2);
        }
        else {
          Vec_PtrPush(p->vClassOld,pAVar2);
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vClassOld), local_34 < iVar1;
          local_34 = local_34 + 1) {
        pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vClassOld,local_34);
        ppClass[local_34] = pAVar2;
        iVar1 = Vec_PtrSize(p->vClassOld);
        ppClass[iVar1 + local_34] = (Aig_Obj_t *)0x0;
        if (local_34 == 0) {
          local_58 = (Aig_Obj_t *)0x0;
        }
        else {
          local_58 = *ppClass;
        }
        Fra_ClassObjSetRepr(pAVar2,local_58);
      }
      iVar1 = Vec_PtrSize(p->vClassOld);
      p_local = (Fra_Cla_t *)(ppClass + (iVar1 << 1));
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vClassNew), local_34 < iVar1;
          local_34 = local_34 + 1) {
        pObj_00 = (Aig_Man_t *)Vec_PtrEntry(p->vClassNew,local_34);
        (&p_local->pAig)[local_34] = pObj_00;
        iVar1 = Vec_PtrSize(p->vClassNew);
        (&p_local->pAig)[iVar1 + local_34] = (Aig_Man_t *)0x0;
        if (local_34 == 0) {
          local_78 = (Aig_Man_t *)0x0;
        }
        else {
          local_78 = p_local->pAig;
        }
        Fra_ClassObjSetRepr((Aig_Obj_t *)pObj_00,(Aig_Obj_t *)local_78);
      }
    }
    return (Aig_Obj_t **)p_local;
  }
  __assert_fail("ppClass[0] != NULL && ppClass[1] != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                ,0x192,"Aig_Obj_t **Fra_RefineClassOne(Fra_Cla_t *, Aig_Obj_t **)");
}

Assistant:

Aig_Obj_t ** Fra_RefineClassOne( Fra_Cla_t * p, Aig_Obj_t ** ppClass )
{
    Aig_Obj_t * pObj, ** ppThis;
    int i;
    assert( ppClass[0] != NULL && ppClass[1] != NULL );

    // check if the class is going to be refined
    for ( ppThis = ppClass + 1; (pObj = *ppThis); ppThis++ )        
        if ( !p->pFuncNodesAreEqual(ppClass[0], pObj) )
            break;
    if ( pObj == NULL )
        return NULL;
    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Vec_PtrPush( p->vClassOld, ppClass[0] );
    for ( ppThis = ppClass + 1; (pObj = *ppThis); ppThis++ )        
        if ( p->pFuncNodesAreEqual(ppClass[0], pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
/*
    printf( "Refining class (" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
        printf( "%d,", pObj->Id );
    printf( ") + (" );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
        printf( "%d,", pObj->Id );
    printf( ")\n" );
*/
    // put the nodes back into the class memory
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassOld)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    ppClass += 2*Vec_PtrSize(p->vClassOld);
    // put the new nodes into the class memory
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClass[i] = pObj;
        ppClass[Vec_PtrSize(p->vClassNew)+i] = NULL;
        Fra_ClassObjSetRepr( pObj, i? ppClass[0] : NULL );
    }
    return ppClass;
}